

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.h
# Opt level: O1

void __thiscall ONX_ModelTest::ONX_ModelTest(ONX_ModelTest *this)

{
  long lVar1;
  
  this->m_test_type = Unset;
  ON_wString::ON_wString(&this->m_source_3dm_file_path);
  ON_wString::ON_wString(&this->m_text_log_3dm_file_path);
  lVar1 = 0;
  this->m_model_3dm_file_version[2] = 0;
  this->m_model_3dm_file_version[0] = 0;
  this->m_model_3dm_file_version[1] = 0;
  this->m_current_test_index = 0;
  this->m_test_result = Unset;
  this->m_test_results[0] = Unset;
  this->m_test_results[1] = Unset;
  this->m_test_results[2] = Unset;
  this->m_test_results[3] = Unset;
  this->m_test_results[4] = Unset;
  this->m_test_results[5] = Unset;
  this->m_test_results[6] = Unset;
  memset(&this->m_error_count,0,0xc0);
  this->m_model[0].super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this->m_model[0].super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_model[1].super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this->m_model[1].super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_model[2].super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this->m_model[2].super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  do {
    ON_SHA1_Hash::ON_SHA1_Hash((ON_SHA1_Hash *)(this->m_model_hash[0].m_digest + lVar1));
    lVar1 = lVar1 + 0x14;
  } while (lVar1 != 0x3c);
  return;
}

Assistant:

~ONX_ModelTest() = default;